

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.cpp
# Opt level: O0

Node * __thiscall
SQCompilation::ClosureHoistingOpt::RemapTransformer::transformDeclExpr
          (RemapTransformer *this,DeclExpr *e)

{
  bool bVar1;
  TreeOp TVar2;
  iterator this_00;
  Id *pIVar3;
  DeclExpr *in_RSI;
  key_type *in_RDI;
  iterator it_1;
  FunctionDecl *f;
  iterator it;
  Decl *d;
  map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
  *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  _Self local_28;
  Id *local_20;
  DeclExpr *local_18;
  
  local_18 = in_RSI;
  local_20 = (Id *)DeclExpr::declaration(in_RSI);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
       ::find(in_stack_ffffffffffffffb8._M_node,in_RDI);
  this_00 = std::
            set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
            ::end((set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
                   *)in_stack_ffffffffffffffa8);
  bVar1 = std::operator==(&local_28,(_Self *)&stack0xffffffffffffffd0);
  if ((bVar1) && (TVar2 = Node::op((Node *)local_20), TVar2 == TO_FUNCTION)) {
    pIVar3 = local_20;
    in_stack_ffffffffffffffc0 =
         std::
         map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x17b8f0);
    in_stack_ffffffffffffffb8 =
         std::
         map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc0,(_Self *)&stack0xffffffffffffffb8);
    if (bVar1) {
      std::_Rb_tree_iterator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>::
      operator->((_Rb_tree_iterator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_> *)
                 0x17b933);
      createId((RemapTransformer *)this_00._M_node,(char *)pIVar3);
      pIVar3 = copyCoordinates<SQCompilation::Id>((Node *)this_00._M_node,pIVar3);
      return (Node *)pIVar3;
    }
  }
  Node::transformChildren
            ((Node *)in_stack_ffffffffffffffc0._M_node,
             (Transformer *)in_stack_ffffffffffffffb8._M_node);
  return (Node *)local_18;
}

Assistant:

Node *ClosureHoistingOpt::RemapTransformer::transformDeclExpr(DeclExpr *e) {

  Decl *d = e->declaration();
  auto it = relocSet.find(e);
  if (it == relocSet.end()) {
    if (d->op() == TO_FUNCTION) {
      FunctionDecl *f = (FunctionDecl *)d;
      auto it = relocMap.find(f);
      if (it != relocMap.end()) {
        return copyCoordinates(e, createId(it->second));
      }
    }
  }

  d->transformChildren(this);
  return e;
}